

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Options_with_int_data>::rec_delete
          (Simplex_tree<Options_with_int_data> *this,Siblings *sib)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  Siblings *sib_00;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
  local_30;
  undefined1 local_28 [16];
  iterator sh;
  Siblings *sib_local;
  Simplex_tree<Options_with_int_data> *this_local;
  
  sh.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
              *)sib;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Options_with_int_data>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>_>
  ::members(sib);
  boost::container::
  flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>
  ::begin((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>
           *)(local_28 + 8));
  while( true ) {
    Simplex_tree_siblings<Gudhi::Simplex_tree<Options_with_int_data>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>_>
    ::members((Simplex_tree_siblings<Gudhi::Simplex_tree<Options_with_int_data>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>_>
               *)sh.m_ptr);
    boost::container::
    flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>
    ::end((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>
           *)local_28);
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
                        *)(local_28 + 8),
                       (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
                        *)local_28);
    iVar1 = sh;
    if (!bVar2) break;
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
    ::vec_iterator(&local_30,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
                    *)(local_28 + 8));
    bVar2 = has_children<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>>>*,false>>
                      (this,&local_30);
    if (bVar2) {
      ppVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
               ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
                             *)(local_28 + 8));
      sib_00 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>::
               children(&ppVar3->second);
      rec_delete(this,sib_00);
    }
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
    ::operator++((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
                  *)(local_28 + 8));
  }
  if (sh.m_ptr !=
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
       *)0x0) {
    Simplex_tree_siblings<Gudhi::Simplex_tree<Options_with_int_data>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>_>
    ::~Simplex_tree_siblings
              ((Simplex_tree_siblings<Gudhi::Simplex_tree<Options_with_int_data>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>,_std::less<int>,_void>_>
                *)sh.m_ptr);
    operator_delete(iVar1.m_ptr,0x28);
  }
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }